

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<arg_res_tuple<long_double,_2UL>_> *
Catch::Generators::
makeGenerators<arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>>
          (arg_res_tuple<long_double,_2UL> *val,arg_res_tuple<long_double,_2UL> *moreGenerators,
          arg_res_tuple<long_double,_2UL> *moreGenerators_1,
          arg_res_tuple<long_double,_2UL> *moreGenerators_2,
          arg_res_tuple<long_double,_2UL> *moreGenerators_3,
          arg_res_tuple<long_double,_2UL> *moreGenerators_4,
          arg_res_tuple<long_double,_2UL> *moreGenerators_5,
          arg_res_tuple<long_double,_2UL> *moreGenerators_6,
          arg_res_tuple<long_double,_2UL> *moreGenerators_7,
          arg_res_tuple<long_double,_2UL> *moreGenerators_8,
          arg_res_tuple<long_double,_2UL> *moreGenerators_9,
          arg_res_tuple<long_double,_2UL> *moreGenerators_10,
          arg_res_tuple<long_double,_2UL> *moreGenerators_11,
          arg_res_tuple<long_double,_2UL> *moreGenerators_12,
          arg_res_tuple<long_double,_2UL> *moreGenerators_13,
          arg_res_tuple<long_double,_2UL> *moreGenerators_14,
          arg_res_tuple<long_double,_2UL> *moreGenerators_15,
          arg_res_tuple<long_double,_2UL> *moreGenerators_16,
          arg_res_tuple<long_double,_2UL> *moreGenerators_17,
          arg_res_tuple<long_double,_2UL> *moreGenerators_18,
          arg_res_tuple<long_double,_2UL> *moreGenerators_19,
          arg_res_tuple<long_double,_2UL> *moreGenerators_20,
          arg_res_tuple<long_double,_2UL> *moreGenerators_21,
          arg_res_tuple<long_double,_2UL> *moreGenerators_22,
          arg_res_tuple<long_double,_2UL> *moreGenerators_23,
          arg_res_tuple<long_double,_2UL> *moreGenerators_24,
          arg_res_tuple<long_double,_2UL> *moreGenerators_25,
          arg_res_tuple<long_double,_2UL> *moreGenerators_26,
          arg_res_tuple<long_double,_2UL> *moreGenerators_27,
          arg_res_tuple<long_double,_2UL> *moreGenerators_28,
          arg_res_tuple<long_double,_2UL> *moreGenerators_29,
          arg_res_tuple<long_double,_2UL> *moreGenerators_30,
          arg_res_tuple<long_double,_2UL> *moreGenerators_31,
          arg_res_tuple<long_double,_2UL> *moreGenerators_32,
          arg_res_tuple<long_double,_2UL> *moreGenerators_33,
          arg_res_tuple<long_double,_2UL> *moreGenerators_34,
          arg_res_tuple<long_double,_2UL> *moreGenerators_35,
          arg_res_tuple<long_double,_2UL> *moreGenerators_36,
          arg_res_tuple<long_double,_2UL> *moreGenerators_37,
          arg_res_tuple<long_double,_2UL> *moreGenerators_38,
          arg_res_tuple<long_double,_2UL> *moreGenerators_39,
          arg_res_tuple<long_double,_2UL> *moreGenerators_40,
          arg_res_tuple<long_double,_2UL> *moreGenerators_41)

{
  arg_res_tuple<long_double,_2UL> *in_RCX;
  arg_res_tuple<long_double,_2UL> *unaff_RBX;
  arg_res_tuple<long_double,_2UL> *unaff_RBP;
  Generators<arg_res_tuple<long_double,_2UL>_> *in_RDI;
  arg_res_tuple<long_double,_2UL> *unaff_R12;
  arg_res_tuple<long_double,_2UL> *unaff_R13;
  arg_res_tuple<long_double,_2UL> *unaff_R14;
  arg_res_tuple<long_double,_2UL> *unaff_R15;
  arg_res_tuple<long_double,_2UL> *unaff_retaddr;
  arg_res_tuple<long_double,_2UL> *in_stack_00000008;
  arg_res_tuple<long_double,_2UL> *in_stack_00000010;
  arg_res_tuple<long_double,_2UL> *in_stack_00000018;
  arg_res_tuple<long_double,_2UL> *in_stack_00000020;
  arg_res_tuple<long_double,_2UL> *in_stack_00000028;
  arg_res_tuple<long_double,_2UL> *in_stack_00000030;
  arg_res_tuple<long_double,_2UL> *in_stack_00000038;
  arg_res_tuple<long_double,_2UL> *in_stack_00000040;
  arg_res_tuple<long_double,_2UL> *in_stack_00000048;
  arg_res_tuple<long_double,_2UL> *in_stack_00000050;
  arg_res_tuple<long_double,_2UL> *in_stack_00000058;
  arg_res_tuple<long_double,_2UL> *in_stack_00000060;
  arg_res_tuple<long_double,_2UL> *in_stack_00000068;
  arg_res_tuple<long_double,_2UL> *in_stack_00000070;
  arg_res_tuple<long_double,_2UL> *in_stack_00000078;
  arg_res_tuple<long_double,_2UL> *in_stack_00000080;
  arg_res_tuple<long_double,_2UL> *in_stack_00000088;
  arg_res_tuple<long_double,_2UL> *in_stack_00000090;
  arg_res_tuple<long_double,_2UL> *in_stack_00000098;
  arg_res_tuple<long_double,_2UL> *in_stack_000000a0;
  arg_res_tuple<long_double,_2UL> *in_stack_000000a8;
  arg_res_tuple<long_double,_2UL> *in_stack_000000b0;
  arg_res_tuple<long_double,_2UL> *in_stack_000000b8;
  arg_res_tuple<long_double,_2UL> *in_stack_000000c0;
  arg_res_tuple<long_double,_2UL> *in_stack_000000c8;
  arg_res_tuple<long_double,_2UL> *in_stack_000000d0;
  arg_res_tuple<long_double,_2UL> *in_stack_000000d8;
  arg_res_tuple<long_double,_2UL> *in_stack_000000e0;
  arg_res_tuple<long_double,_2UL> *in_stack_000000e8;
  arg_res_tuple<long_double,_2UL> *in_stack_000000f0;
  arg_res_tuple<long_double,_2UL> *in_stack_000000f8;
  arg_res_tuple<long_double,_2UL> *in_stack_fffffffffffffd88;
  GeneratorWrapper<arg_res_tuple<long_double,_2UL>_> *in_stack_ffffffffffffff88;
  
  value<arg_res_tuple<long_double,2ul>>(in_stack_fffffffffffffd88);
  makeGenerators<arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>,arg_res_tuple<long_double,2ul>>
            (in_stack_ffffffffffffff88,in_RCX,in_stack_00000048,in_stack_00000050,in_stack_00000058,
             unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
             in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060,
             in_stack_00000068,in_stack_00000070,in_stack_00000078,in_stack_00000080,
             in_stack_00000088,in_stack_00000090,in_stack_00000098,in_stack_000000a0,
             in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,in_stack_000000c0,
             in_stack_000000c8,in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,
             in_stack_000000e8,in_stack_000000f0,in_stack_000000f8);
  GeneratorWrapper<arg_res_tuple<long_double,_2UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<long_double,_2UL>_> *)0x3e9179);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }